

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadstate.cpp
# Opt level: O0

void __thiscall
ThreadState::ThreadState(ThreadState *this,TID own_tid,shared_ptr<ThreadState> *parent)

{
  bool bVar1;
  VC_ID __i;
  element_type *peVar2;
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>::iterator,_bool>
  local_58;
  pair<unsigned_int,_unsigned_long> local_40 [2];
  __shared_ptr_access<ThreadState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  shared_ptr<ThreadState> *parent_local;
  ThreadState *pTStack_10;
  TID own_tid_local;
  ThreadState *this_local;
  
  local_20 = (__shared_ptr_access<ThreadState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)parent;
  parent_local._4_4_ = own_tid;
  pTStack_10 = this;
  VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::VectorClock
            (&this->
              super_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>);
  __i = VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::make_id
                  (parent_local._4_4_);
  std::atomic<unsigned_long>::atomic(&this->id,__i);
  StackTrace::StackTrace(&this->traceDepot);
  std::pair<unsigned_int,_unsigned_long>::pair<unsigned_int_&,_std::atomic<unsigned_long>_&,_true>
            (local_40,(uint *)((long)&parent_local + 4),&this->id);
  phmap::container_internal::
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::insert(&local_58,
           (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
            *)this,local_40);
  bVar1 = std::operator!=((shared_ptr<ThreadState> *)local_20,(nullptr_t)0x0);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<ThreadState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    phmap::
    flat_hash_map<unsigned_int,_unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
    ::operator=((flat_hash_map<unsigned_int,_unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                 *)this,(flat_hash_map<unsigned_int,_unsigned_long,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                         *)peVar2);
  }
  return;
}

Assistant:

ThreadState::ThreadState(VectorClock::TID own_tid,
                         const std::shared_ptr<ThreadState>& parent)
    : id(VectorClock::make_id(own_tid)) {
  vc.insert({own_tid, id});
  if (parent != nullptr) {
    // if parent exists vector clock
    vc = parent->vc;
  }
}